

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPrePartialsStates
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          int *states2,float *matrices2,int startPattern,int endPattern)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  float *pfVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  float *pfVar16;
  float *pfVar17;
  ulong uVar18;
  float *pfVar19;
  undefined1 auVar20 [16];
  int local_c0;
  int local_bc;
  long local_b8;
  float *local_b0;
  long local_a8;
  float *local_98;
  
  uVar1 = this->kStateCount;
  uVar12 = uVar1 + 3;
  if (-1 < (int)uVar1) {
    uVar12 = uVar1;
  }
  if ((long)this->kPartialsSize != 0) {
    memset(destP,0,(long)this->kPartialsSize << 2);
  }
  iVar2 = this->kCategoryCount;
  if (0 < (long)iVar2) {
    uVar9 = uVar1 + 1;
    iVar3 = this->kPartialsPaddedStateCount;
    iVar4 = this->kPatternCount;
    iVar5 = this->kMatrixSize;
    local_98 = matrices1 + 3;
    local_bc = iVar3 * startPattern;
    local_b8 = 0;
    local_c0 = 0;
    local_b0 = matrices1;
    do {
      if (startPattern < endPattern) {
        pfVar17 = destP + local_bc;
        pfVar14 = partials1 + (iVar4 * (int)local_b8 + startPattern) * iVar3;
        local_a8 = (long)startPattern;
        do {
          if (0 < (int)uVar1) {
            iVar6 = states2[local_a8];
            uVar13 = 0;
            pfVar10 = local_98;
            lVar11 = (long)local_c0;
            pfVar19 = local_b0;
            do {
              uVar18 = 0;
              fVar7 = matrices2[iVar6 + lVar11] * pfVar14[uVar13];
              auVar20 = ZEXT416((uint)fVar7);
              pfVar16 = pfVar17;
              if (3 < (int)uVar1) {
                lVar15 = 0;
                uVar18 = 0;
                do {
                  auVar8 = vfmadd213ss_fma(ZEXT416((uint)pfVar10[uVar18 - 3]),ZEXT416((uint)fVar7),
                                           ZEXT416((uint)pfVar17[uVar18]));
                  pfVar17[uVar18] = auVar8._0_4_;
                  auVar8 = vfmadd213ss_fma(ZEXT416((uint)pfVar10[uVar18 - 2]),ZEXT416((uint)fVar7),
                                           ZEXT416((uint)pfVar17[uVar18 + 1]));
                  pfVar17[uVar18 + 1] = auVar8._0_4_;
                  auVar8 = vfmadd213ss_fma(ZEXT416((uint)pfVar10[uVar18 - 1]),auVar20,
                                           ZEXT416((uint)pfVar17[uVar18 + 2]));
                  pfVar17[uVar18 + 2] = auVar8._0_4_;
                  auVar8 = vfmadd213ss_fma(ZEXT416((uint)pfVar10[uVar18]),auVar20,
                                           ZEXT416((uint)pfVar17[uVar18 + 3]));
                  pfVar17[uVar18 + 3] = auVar8._0_4_;
                  uVar18 = uVar18 + 4;
                  lVar15 = lVar15 + 0x10;
                } while ((long)uVar18 < (long)(int)(uVar12 & 0xfffffffc));
                pfVar16 = (float *)(lVar15 + (long)pfVar17);
              }
              if ((int)uVar18 < (int)uVar1) {
                lVar15 = 0;
                do {
                  auVar8 = vfmadd213ss_fma(ZEXT416((uint)pfVar19[(uVar18 & 0xffffffff) + lVar15]),
                                           auVar20,ZEXT416((uint)pfVar16[lVar15]));
                  pfVar16[lVar15] = auVar8._0_4_;
                  lVar15 = lVar15 + 1;
                } while ((ulong)uVar1 - (uVar18 & 0xffffffff) != lVar15);
              }
              lVar11 = lVar11 + (int)uVar9;
              uVar13 = uVar13 + 1;
              pfVar10 = pfVar10 + uVar9;
              pfVar19 = pfVar19 + uVar9;
            } while (uVar13 != uVar1);
          }
          pfVar17 = pfVar17 + iVar3;
          pfVar14 = pfVar14 + iVar3;
          local_a8 = local_a8 + 1;
        } while (local_a8 != endPattern);
      }
      local_b8 = local_b8 + 1;
      local_c0 = local_c0 + iVar5;
      local_98 = local_98 + iVar5;
      local_bc = local_bc + iVar4 * iVar3;
      local_b0 = local_b0 + iVar5;
    } while (local_b8 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                              const REALTYPE* partials1,
                                                              const REALTYPE* matrices1,
                                                              const int* states2,
                                                              const REALTYPE* matrices2,
                                                              int startPattern,
                                                              int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];

        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state2 = states2[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;

                tmpdestPtr = destPtr;
                const REALTYPE  MjPj = matrices2[w + state2] * partials1Ptr[i];

                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }

                w += matrixIncr;
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
        }
    }

}